

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O1

CompressionType
duckdb::ForceCompression
          (vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>
           *compression_functions,CompressionType compression_type)

{
  CompressionType CVar1;
  reference pvVar2;
  bool bVar3;
  size_type sVar4;
  
  if ((compression_functions->
      super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
      ).
      super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (compression_functions->
      super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
      ).
      super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = false;
  }
  else {
    sVar4 = 0;
    do {
      pvVar2 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::operator[]
                         (compression_functions,sVar4);
      optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(pvVar2);
      bVar3 = false;
      if (pvVar2->ptr->type == compression_type) {
        bVar3 = true;
        break;
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 < (ulong)((long)(compression_functions->
                                   super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(compression_functions->
                                   super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (bVar3) {
    if ((compression_functions->
        super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
        ).
        super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (compression_functions->
        super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
        ).
        super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar4 = 0;
      do {
        pvVar2 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::operator[]
                           (compression_functions,sVar4);
        optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(pvVar2);
        CVar1 = pvVar2->ptr->type;
        if (CVar1 != compression_type && CVar1 != COMPRESSION_UNCOMPRESSED) {
          pvVar2 = vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>::operator[]
                             (compression_functions,sVar4);
          pvVar2->ptr = (CompressionFunction *)0x0;
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 < (ulong)((long)(compression_functions->
                                     super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(compression_functions->
                                     super_vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_std::allocator<duckdb::optional_ptr<duckdb::CompressionFunction,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    compression_type = COMPRESSION_AUTO;
  }
  return compression_type;
}

Assistant:

CompressionType ForceCompression(vector<optional_ptr<CompressionFunction>> &compression_functions,
                                 CompressionType compression_type) {
// On of the force_compression flags has been set
// check if this compression method is available
#ifdef DEBUG
	if (CompressionTypeIsDeprecated(compression_type)) {
		throw InternalException("Deprecated compression type: %s", CompressionTypeToString(compression_type));
	}
#endif
	bool found = false;
	for (idx_t i = 0; i < compression_functions.size(); i++) {
		auto &compression_function = *compression_functions[i];
		if (compression_function.type == compression_type) {
			found = true;
			break;
		}
	}
	if (!found) {
		return CompressionType::COMPRESSION_AUTO;
	}
	// the force_compression method is available
	// clear all other compression methods
	// except the uncompressed method, so we can fall back on that
	for (idx_t i = 0; i < compression_functions.size(); i++) {
		auto &compression_function = *compression_functions[i];
		if (compression_function.type == CompressionType::COMPRESSION_UNCOMPRESSED) {
			continue;
		}
		if (compression_function.type != compression_type) {
			compression_functions[i] = nullptr;
		}
	}
	return compression_type;
}